

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9MemObjInit(jx9_vm *pVm,jx9_value *pObj)

{
  jx9_value *pObj_local;
  jx9_vm *pVm_local;
  
  SyZero(pObj,0x40);
  pObj->pVm = pVm;
  SyBlobInit(&pObj->sBlob,&pVm->sAllocator);
  pObj->iFlags = 0x20;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjInit(jx9_vm *pVm, jx9_value *pObj)
{
	/* Zero the structure */
	SyZero(pObj, sizeof(jx9_value));
	/* Initialize fields */
	pObj->pVm = pVm;
	SyBlobInit(&pObj->sBlob, &pVm->sAllocator);
	/* Set the NULL type */
	pObj->iFlags = MEMOBJ_NULL;
	return SXRET_OK;
}